

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall
MakefileGenerator::writeSubTargets
          (MakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> targets,
          int flags)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  QMakeProject *pQVar4;
  SubTarget *pSVar5;
  _List_node_base *p_Var6;
  Span *pSVar7;
  SourceFiles *pSVar8;
  Span *pSVar9;
  QString string;
  QString string_00;
  Data *pDVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  QString *pQVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  char (*pacVar16) [2];
  Data *pDVar17;
  undefined1 auVar18 [8];
  QHash<ReplaceExtraCompilerCacheKey,_QString> QVar19;
  bool bVar20;
  char cVar21;
  ProStringList *pPVar22;
  QTextStream *pQVar23;
  iterator iVar24;
  iterator iVar25;
  QList<ProString> *pQVar26;
  qsizetype qVar27;
  ProStringList *pPVar28;
  const_iterator cVar29;
  Node<QString,_QHashDummyValue> *pNVar30;
  uint in_ECX;
  undefined4 in_register_00000014;
  QList<MakefileGenerator::SubTarget_*> *this_00;
  char *pcVar31;
  Span *pSVar32;
  QString *pQVar33;
  SequentialInstallData *pSVar34;
  storage_type *psVar35;
  MakefileGenerator *pMVar36;
  ulong uVar37;
  ulong uVar38;
  ProString *pPVar39;
  long lVar40;
  long in_FS_OFFSET;
  bool bVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QAnyStringView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QStringView config;
  QStringView config_00;
  MakefileGenerator *this_01;
  SequentialInstallData *pSVar62;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 uVar63;
  default_delete<SequentialInstallData> *local_2c0;
  ProString local_2a8;
  undefined1 local_278 [40];
  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]> local_250;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> local_238;
  undefined1 local_218 [24];
  QHash<QString,_QHashDummyValue> local_200;
  QString local_1f8;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]> local_1d8;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> local_198;
  QString local_178;
  undefined1 local_158 [8];
  QHash<ReplaceExtraCompilerCacheKey,_QString> QStack_150;
  long local_148;
  QString local_138;
  undefined1 local_118 [8];
  char16_t *pcStack_110;
  undefined1 *local_108;
  QString local_f8;
  ProKey rtkey;
  QString local_a8;
  QArrayDataPointer<QString> local_88;
  ProKey rkey;
  
  this_00 = (QList<MakefileGenerator::SubTarget_*> *)CONCAT44(in_register_00000014,flags);
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = this->project;
  ProKey::ProKey(&rkey,"QMAKE_EXTRA_INCLUDES");
  pPVar22 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar22->super_QList<ProString>).d.size != 0) {
    pPVar39 = (pPVar22->super_QList<ProString>).d.ptr;
    do {
      pQVar23 = (QTextStream *)QTextStream::operator<<(t,anon_var_dwarf_3dd610 + 0xb);
      pQVar23 = operator<<(pQVar23,pPVar39);
      Qt::endl(pQVar23);
      pPVar39 = pPVar39 + 1;
    } while (pPVar39 !=
             (pPVar22->super_QList<ProString>).d.ptr + (pPVar22->super_QList<ProString>).d.size);
  }
  if ((in_ECX & 4) == 0) {
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[6])(this,t);
    QTextStream::operator<<(t,"SUBTARGETS    = ");
    if ((this_00->d).size != 0) {
      uVar37 = 0;
      do {
        pQVar23 = (QTextStream *)QTextStream::operator<<(t," \\\n\t\t");
        QTextStream::operator<<(pQVar23,(QString *)&(this_00->d).ptr[uVar37]->target);
        uVar37 = uVar37 + 1;
      } while (uVar37 < (ulong)(this_00->d).size);
    }
    pQVar23 = (QTextStream *)Qt::endl(t);
    Qt::endl(pQVar23);
  }
  this_01 = this;
  writeExtraVariables(this,t);
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = this->project;
  ProKey::ProKey(&rtkey,"QMAKE_ABSOLUTE_SOURCE_PATH");
  QMakeEvaluator::first(&rkey.super_ProString,&pQVar4->super_QMakeEvaluator,&rtkey);
  ProString::toQString(&local_a8,&rkey.super_ProString);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((in_ECX & 8) == 0) {
    QVar42.m_data = (storage_type *)0xa;
    QVar42.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar42);
    rtkey.super_ProString.m_string.d.d = rkey.super_ProString.m_string.d.d;
    rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
    rtkey.super_ProString.m_string.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)&rtkey);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar43.m_data = (storage_type *)0x3;
    QVar43.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar43);
    local_2a8.m_string.d.d = rkey.super_ProString.m_string.d.d;
    local_2a8.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
    local_2a8.m_string.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_2a8.m_string);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar44.m_data = (storage_type *)0x5;
    QVar44.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar44);
    local_f8.d.d = rkey.super_ProString.m_string.d.d;
    local_f8.d.ptr = rkey.super_ProString.m_string.d.ptr;
    local_f8.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_f8);
    QList<QString>::end((QList<QString> *)&local_88);
    QVar45.m_data = (storage_type *)0x9;
    QVar45.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar45);
    local_118 = (undefined1  [8])rkey.super_ProString.m_string.d.d;
    pcStack_110 = rkey.super_ProString.m_string.d.ptr;
    local_108 = (undefined1 *)rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)local_118);
    QList<QString>::end((QList<QString> *)&local_88);
    pcVar31 = "install_subtargets";
    if ((in_ECX & 1) == 0) {
      pcVar31 = "install";
    }
    psVar35 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar35 + (long)(pcVar31 + 1);
      psVar35 = psVar35 + 1;
    } while (*pcVar1 != '\0');
    QVar46.m_data = psVar35;
    QVar46.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar46);
    local_138.d.d = rkey.super_ProString.m_string.d.d;
    local_138.d.ptr = rkey.super_ProString.m_string.d.ptr;
    local_138.d.size = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,&local_138);
    QList<QString>::end((QList<QString> *)&local_88);
    pcVar31 = "uninstall_subtargets";
    if ((in_ECX & 1) == 0) {
      pcVar31 = "uninstall";
    }
    psVar35 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar35 + (long)(pcVar31 + 1);
      psVar35 = psVar35 + 1;
    } while (*pcVar1 != '\0');
    QVar47.m_data = psVar35;
    QVar47.m_size = (qsizetype)&rkey;
    QString::fromUtf8(QVar47);
    local_158 = (undefined1  [8])rkey.super_ProString.m_string.d.d;
    QStack_150.d = (Data *)rkey.super_ProString.m_string.d.ptr;
    local_148 = rkey.super_ProString.m_string.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)local_158);
    QList<QString>::end((QList<QString> *)&local_88);
    if (local_158 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_158,2,0x10);
      }
    }
    if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_118 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_118,2,0x10);
      }
    }
    if ((Span *)local_f8.d.d != (Span *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
      LOCK();
      *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
           *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
        QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar4 = this_01->project;
  QVar48.m_data = &DAT_0000000c;
  QVar48.m_size = (qsizetype)&rkey;
  QString::fromUtf8(QVar48);
  pDVar10 = rkey.super_ProString.m_string.d.d;
  config.m_data = rkey.super_ProString.m_string.d.ptr;
  config.m_size = rkey.super_ProString.m_string.d.size;
  bVar20 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config,false);
  if (pDVar10 != (Data *)0x0) {
    LOCK();
    (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
    }
  }
  bVar41 = (this_00->d).size == 0;
  uVar63 = CONCAT13(bVar41,(int3)in_stack_fffffffffffffd1c);
  pSVar34 = (SequentialInstallData *)t;
  if (bVar41) {
    local_2c0 = (default_delete<SequentialInstallData> *)0x0;
    pQVar23 = t;
  }
  else {
    uVar37 = 0;
    local_2c0 = (default_delete<SequentialInstallData> *)0x0;
    do {
      pSVar5 = (this_00->d).ptr[uVar37];
      rtkey.super_ProString.m_string.d.d = (pSVar5->in_directory).d.d;
      rtkey.super_ProString.m_string.d.ptr = (pSVar5->in_directory).d.ptr;
      rtkey.super_ProString.m_string.d.size = (pSVar5->in_directory).d.size;
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((rtkey.super_ProString.m_string.d.size != 0) &&
         (cVar21 = QString::endsWith((QString *)&rtkey,0x2e5bf0), cVar21 == '\0')) {
        QString::append((QString *)&rtkey);
      }
      local_2a8.m_string.d.d = (pSVar5->out_directory).d.d;
      local_2a8.m_string.d.ptr = (pSVar5->out_directory).d.ptr;
      local_2a8.m_string.d.size = (pSVar5->out_directory).d.size;
      if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
        LOCK();
        ((__atomic_base<int> *)&(((QString *)((Span *)local_2a8.m_string.d.d)->offsets)->d).d)->_M_i
             = ((__atomic_base<int> *)&(((QString *)((Span *)local_2a8.m_string.d.d)->offsets)->d).d
               )->_M_i + 1;
        UNLOCK();
      }
      if (((Span *)local_2a8.m_string.d.size != (Span *)0x0) &&
         (cVar21 = QString::endsWith((QString *)&local_2a8,0x2e5bf0), cVar21 == '\0')) {
        QString::append((QString *)&local_2a8);
      }
      if (((undefined1 *)local_a8.d.size != (undefined1 *)0x0) &&
         (cVar21 = QString::startsWith((QString *)&local_2a8,(CaseSensitivity)&local_a8),
         cVar21 != '\0')) {
        QString::mid((longlong)local_118,(longlong)&local_2a8);
        rkey.super_ProString._24_8_ = local_108;
        rkey.super_ProString.m_string.d.size = (qsizetype)pcStack_110;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)local_118;
        rkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
        local_118 = (undefined1  [8])0x0;
        pcStack_110 = (char16_t *)0x0;
        local_108 = (undefined1 *)0x0;
        QStringBuilder<QString_&,_QString>::convertTo<QString>
                  (&local_f8,(QStringBuilder<QString_&,_QString> *)&rkey);
        qVar27 = local_f8.d.size;
        pDVar17 = local_f8.d.d;
        pcVar11 = local_2a8.m_string.d.ptr;
        pDVar10 = local_2a8.m_string.d.d;
        local_f8.d.d = local_2a8.m_string.d.d;
        local_2a8.m_string.d.d = pDVar17;
        local_2a8.m_string.d.ptr = local_f8.d.ptr;
        local_f8.d.ptr = pcVar11;
        local_f8.d.size = local_2a8.m_string.d.size;
        local_2a8.m_string.d.size = qVar27;
        if ((Span *)pDVar10 != (Span *)0x0) {
          LOCK();
          *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d =
               *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
        if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
          LOCK();
          *(int *)rkey.super_ProString.m_string.d.ptr =
               *(int *)rkey.super_ProString.m_string.d.ptr + -1;
          UNLOCK();
          if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
          }
        }
        if (local_118 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_118,2,0x10);
          }
        }
      }
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if ((Span *)local_2a8.m_string.d.size == (Span *)0x0) {
        QVar49.m_data = (storage_type *)0x2;
        QVar49.m_size = (qsizetype)&rkey;
        QString::fromUtf8(QVar49);
        local_f8.d.d = rkey.super_ProString.m_string.d.d;
        local_f8.d.ptr = rkey.super_ProString.m_string.d.ptr;
        local_f8.d.size = rkey.super_ProString.m_string.d.size;
      }
      else {
        (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (local_118,this_01,&local_2a8);
        rkey.super_ProString._24_8_ = local_108;
        rkey.super_ProString.m_string.d.size = (qsizetype)pcStack_110;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)local_118;
        local_108 = (undefined1 *)0x0;
        rkey.super_ProString.m_string.d.d = (Data *)anon_var_dwarf_156f16;
        local_118 = (undefined1  [8])0x0;
        pcStack_110 = (char16_t *)0x0;
        rkey.super_ProString._32_8_ = (long)" ) && " + 2;
        QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
        convertTo<QString>(&local_f8,
                           (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                            *)&rkey);
        if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
          LOCK();
          *(int *)rkey.super_ProString.m_string.d.ptr =
               *(int *)rkey.super_ProString.m_string.d.ptr + -1;
          UNLOCK();
          if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
            QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
          }
        }
        if (local_118 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_118,2,0x10);
          }
        }
      }
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pcStack_110 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                (&local_138,this_01,&pSVar5->makefile);
      qVar27 = local_138.d.size;
      rkey.super_ProString.m_string.d.size = (qsizetype)local_138.d.ptr;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)local_138.d.d;
      rkey.super_ProString.m_string.d.d = (Data *)0x2ae87e;
      local_138.d.d = (Data *)0x0;
      local_138.d.ptr = (char16_t *)0x0;
      local_138.d.size = 0;
      qVar12 = local_138.d.size;
      local_138.d.size._0_4_ = (undefined4)qVar27;
      local_138.d.size._4_4_ = SUB84(qVar27,4);
      rkey.super_ProString.m_offset = (undefined4)local_138.d.size;
      rkey.super_ProString.m_length = local_138.d.size._4_4_;
      local_138.d.size = qVar12;
      QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
                ((QString *)local_118,(QStringBuilder<const_char_(&)[5],_QString> *)&rkey);
      if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
        LOCK();
        *(int *)rkey.super_ProString.m_string.d.ptr =
             *(int *)rkey.super_ProString.m_string.d.ptr + -1;
        UNLOCK();
        if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
        }
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_138.d.size = 0;
      local_138.d.d = (Data *)0x0;
      local_138.d.ptr = (char16_t *)0x0;
      local_148 = 0;
      local_158 = (undefined1  [8])0x0;
      QStack_150.d = (Data *)0x0;
      if ((pSVar5->profile).d.size != 0) {
        QString::operator=(&local_138,(QString *)&pSVar5->makefile);
        local_1b8._0_8_ = (Data *)&rtkey;
        local_1b8._8_8_ = &pSVar5->profile;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)&local_198,(QStringBuilder<QString_&,_QString_&> *)local_1b8);
        pMVar36 = this_01;
        fileFixify(&local_178,this_01,(QString *)&local_198,(FileFixifyTypes)0x4,true);
        (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (&rkey,this_01,&local_178);
        qVar27 = rkey.super_ProString.m_string.d.size;
        pDVar10 = rkey.super_ProString.m_string.d.d;
        QVar19.d = QStack_150.d;
        auVar18 = local_158;
        rkey.super_ProString.m_string.d.d = (Data *)local_158;
        local_158 = (undefined1  [8])pDVar10;
        QStack_150.d = (Data *)rkey.super_ProString.m_string.d.ptr;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)QVar19.d;
        rkey.super_ProString.m_string.d.size = local_148;
        local_148 = qVar27;
        this_01 = pMVar36;
        if (auVar18 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)auVar18)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)auVar18)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)auVar18)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)auVar18,2,0x10);
            this_01 = pMVar36;
          }
        }
        if ((Span *)local_178.d.d != (Span *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((Data *)local_198.a.a != (Data *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_198.a.a,2,0x10);
          }
        }
        cVar21 = QString::startsWith((QString *)&local_138,(CaseSensitivity)(Data *)&rtkey);
        if (cVar21 != '\0') {
          QString::mid((longlong)&rkey,(longlong)&local_138);
          qVar27 = rkey.super_ProString.m_string.d.size;
          pDVar17 = rkey.super_ProString.m_string.d.d;
          pcVar11 = local_138.d.ptr;
          pDVar10 = local_138.d.d;
          rkey.super_ProString.m_string.d.d = local_138.d.d;
          local_138.d.d = pDVar17;
          local_138.d.ptr = rkey.super_ProString.m_string.d.ptr;
          rkey.super_ProString.m_string.d.ptr = pcVar11;
          rkey.super_ProString.m_string.d.size = local_138.d.size;
          local_138.d.size = qVar27;
          if (&pDVar10->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
            }
          }
        }
        (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                  (&rkey,this_01,&local_138);
        qVar27 = rkey.super_ProString.m_string.d.size;
        pDVar17 = rkey.super_ProString.m_string.d.d;
        pcVar11 = local_138.d.ptr;
        pDVar10 = local_138.d.d;
        rkey.super_ProString.m_string.d.d = local_138.d.d;
        local_138.d.d = pDVar17;
        local_138.d.ptr = rkey.super_ProString.m_string.d.ptr;
        rkey.super_ProString.m_string.d.ptr = pcVar11;
        rkey.super_ProString.m_string.d.size = local_138.d.size;
        local_138.d.size = qVar27;
        if (&pDVar10->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
        pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)&pSVar5->target);
        QTextStream::operator<<(pQVar23,"-qmake_all: ");
        if ((in_ECX & 2) == 0) {
          if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
            local_178.d.d = (Data *)0x0;
            local_178.d.ptr = (char16_t *)0x0;
            local_178.d.size = 0;
            QVar50.m_data = (storage_type *)0xb;
            QVar50.m_size = (qsizetype)&rkey;
            QString::fromUtf8(QVar50);
            local_198.a.a = (QString *)rkey.super_ProString.m_string.d.d;
            local_198.a.b = (char (*) [2])rkey.super_ProString.m_string.d.ptr;
            local_198.b = (QString *)rkey.super_ProString.m_string.d.size;
            QVar51.m_data = (storage_type *)0xa;
            QVar51.m_size = (qsizetype)&rkey;
            pMVar36 = (MakefileGenerator *)0xa;
            QString::fromUtf8(QVar51);
            local_1b8._0_8_ = rkey.super_ProString.m_string.d.d;
            local_1b8._8_8_ = rkey.super_ProString.m_string.d.ptr;
            local_1a8 = (undefined1 *)rkey.super_ProString.m_string.d.size;
            valGlue((QString *)&rkey,pMVar36,&pSVar5->depends,&local_178,(QString *)&local_198,
                    (QString *)local_1b8);
            QTextStream::operator<<(t,(QString *)&rkey);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Data *)local_1b8._0_8_ != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
              }
            }
            if ((Data *)local_198.a.a != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_198.a.a,2,0x10);
              }
            }
            if ((Span *)local_178.d.d != (Span *)0x0) {
              LOCK();
              *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
                   *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
              UNLOCK();
              if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
                QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
        }
        else if (uVar37 != 0) {
          pQVar23 = (QTextStream *)
                    QTextStream::operator<<(t,(QString *)&(this_00->d).ptr[uVar37 - 1]->target);
          QTextStream::operator<<(pQVar23,"-qmake_all");
        }
        QTextStream::operator<<(t," FORCE\n\t");
        if (rtkey.super_ProString.m_string.d.size != 0) {
          mkdir_p_asstring((QString *)&rkey,this_01,&local_2a8.m_string,true);
          pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)&rkey);
          QTextStream::operator<<(pQVar23,(QString *)&local_f8);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        pQVar23 = (QTextStream *)QTextStream::operator<<(t,"$(QMAKE) -o ");
        pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_138);
        pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,' ');
        pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)local_158);
        buildArgs((QString *)&rkey,this_01,false);
        QTextStream::operator<<(pQVar23,(QString *)&rkey);
        if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (bVar20) {
          Qt::endl(t);
        }
        else {
          local_178.d.d = (Data *)local_118;
          local_178.d.ptr = L" qmake_all";
          QStringBuilder<QString_&,_const_char_(&)[11]>::convertTo<QString>
                    ((QString *)&rkey,(QStringBuilder<QString_&,_const_char_(&)[11]> *)&local_178);
          (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[8])
                    (this_01,t,&local_f8,&rkey);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      pQVar33 = &pSVar5->target;
      pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
      QTextStream::operator<<(pQVar23,":");
      rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[10])
                ((QArrayDataPointer<ProString> *)&rkey);
      if (rkey.super_ProString.m_string.d.size != 0) {
        pQVar23 = (QTextStream *)QTextStream::operator<<(t," ");
        valList(&local_178,this_01,(ProStringList *)&rkey);
        QTextStream::operator<<(pQVar23,(QString *)&local_178);
        if ((Span *)local_178.d.d != (Span *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
        pQVar23 = (QTextStream *)QTextStream::operator<<(t," ");
        valList(&local_178,this_01,&pSVar5->depends);
        QTextStream::operator<<(pQVar23,(QString *)&local_178);
        if ((Span *)local_178.d.d != (Span *)0x0) {
          LOCK();
          *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
               *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QTextStream::operator<<(t," FORCE");
      writeSubTargetCall(this_01,t,(QString *)&rtkey,(QString *)local_158,&local_2a8.m_string,
                         &local_138,&local_f8,(QString *)local_118);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&rkey);
      if (local_88.size != 0) {
        uVar38 = 0;
        do {
          local_178.d.d = local_88.ptr[uVar38].d.d;
          local_178.d.ptr = local_88.ptr[uVar38].d.ptr;
          local_178.d.size = local_88.ptr[uVar38].d.size;
          if ((Span *)local_178.d.d != (Span *)0x0) {
            LOCK();
            *(int *)&(((QString *)((Span *)local_178.d.d)->offsets)->d).d =
                 *(int *)&(((QString *)((Span *)local_178.d.d)->offsets)->d).d + 1;
            UNLOCK();
          }
          bVar41 = comparesEqual(&local_178,"install_subtargets");
          if (bVar41) {
            pcVar31 = "-install";
LAB_0017a2ff:
            QVar52.m_size = pcVar31 + 1;
            QVar52.field_0.m_data = &local_178;
            QString::assign(QVar52);
          }
          else {
            bVar41 = comparesEqual(&local_178,"uninstall_subtargets");
            if (bVar41) {
              pcVar31 = ".uninstall";
              goto LAB_0017a2ff;
            }
            bVar41 = comparesEqual(&local_178,"make_first");
            pDVar10 = local_178.d.d;
            if (bVar41) {
              local_178.d.d = (Data *)0x0;
              local_178.d.ptr = (char16_t *)0x0;
              local_178.d.size = 0;
              if ((Span *)pDVar10 != (Span *)0x0) {
                LOCK();
                *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
                }
              }
            }
          }
          pQVar4 = this_01->project;
          QVar53.m_data = (storage_type *)0x9;
          QVar53.m_size = (qsizetype)&rkey;
          QString::fromUtf8(QVar53);
          pDVar10 = rkey.super_ProString.m_string.d.d;
          config_00.m_data = rkey.super_ProString.m_string.d.ptr;
          config_00.m_size = rkey.super_ProString.m_string.d.size;
          bVar41 = QMakeEvaluator::isActiveConfig(&pQVar4->super_QMakeEvaluator,config_00,false);
          if (bVar41) {
            bVar41 = comparesEqual(&local_178,"install");
            if (pDVar10 != (Data *)0x0) {
              LOCK();
              (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
              }
            }
            t = (QTextStream *)pSVar34;
            if (bVar41) {
              if (local_2c0 == (default_delete<SequentialInstallData> *)0x0) {
                local_2c0 = (default_delete<SequentialInstallData> *)operator_new(0x40);
                *(undefined8 *)local_2c0 = 0;
                *(char16_t **)(local_2c0 + 8) = (char16_t *)0x0;
                *(qsizetype *)(local_2c0 + 0x10) = 0;
                *(undefined8 *)(local_2c0 + 0x18) = 0;
                *(char16_t **)(local_2c0 + 0x20) = (char16_t *)0x0;
                *(qsizetype *)(local_2c0 + 0x28) = 0;
                QTextStream::QTextStream((QTextStream *)(local_2c0 + 0x30),local_2c0 + 0x18,3);
              }
              rkey.super_ProString.m_string.d.ptr =
                   (char16_t *)CONCAT71(rkey.super_ProString.m_string.d.ptr._1_7_,0x2d);
              rkey.super_ProString.m_string.d.d = (Data *)pQVar33;
              ::operator+=((QString *)local_2c0,(QStringBuilder<QString_&,_char> *)&rkey);
              local_198.a.a = (QString *)local_118;
              local_198.a.b = (char (*) [2])0x2b1f52;
              local_198.b = &local_178;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>((QString *)&rkey,&local_198);
              writeSubTargetCall(this_01,(QTextStream *)(local_2c0 + 0x30),(QString *)&rtkey,
                                 (QString *)local_158,&local_2a8.m_string,&local_138,&local_f8,
                                 (QString *)&rkey);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
              lVar40 = *(long *)(local_2c0 + 0x28);
              t = (QTextStream *)pSVar34;
              if (lVar40 != 0) {
                do {
                  if (((*(char16_t **)(local_2c0 + 0x20))[lVar40 + -1] != L'\r') &&
                     (t = (QTextStream *)pSVar34,
                     (*(char16_t **)(local_2c0 + 0x20))[lVar40 + -1] != L'\n')) break;
                  QString::chop((longlong)(local_2c0 + 0x18));
                  lVar40 = *(long *)(local_2c0 + 0x28);
                  t = (QTextStream *)pSVar34;
                } while (lVar40 != 0);
              }
            }
          }
          else {
            t = (QTextStream *)pSVar34;
            if (pDVar10 != (Data *)0x0) {
              LOCK();
              (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
                t = (QTextStream *)pSVar34;
              }
            }
          }
          pSVar34 = (SequentialInstallData *)t;
          if ((in_ECX & 2) != 0) {
            pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
            pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,"-");
            pQVar23 = (QTextStream *)
                      QTextStream::operator<<(pQVar23,(QString *)(local_88.ptr + uVar38));
            QTextStream::operator<<(pQVar23,"-ordered:");
            if (uVar37 != 0) {
              pQVar23 = (QTextStream *)QTextStream::operator<<(t," ");
              pQVar23 = (QTextStream *)
                        QTextStream::operator<<
                                  (pQVar23,(QString *)&(this_00->d).ptr[uVar37 - 1]->target);
              pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,"-");
              pQVar23 = (QTextStream *)
                        QTextStream::operator<<(pQVar23,(QString *)(local_88.ptr + uVar38));
              QTextStream::operator<<(pQVar23,"-ordered ");
            }
            QTextStream::operator<<(t," FORCE");
            local_198.a.a = (QString *)local_118;
            local_198.a.b = (char (*) [2])0x2b1f52;
            local_198.b = &local_178;
            QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
            convertTo<QString>((QString *)&rkey,&local_198);
            writeSubTargetCall(this_01,t,(QString *)&rtkey,(QString *)local_158,&local_2a8.m_string,
                               &local_138,&local_f8,(QString *)&rkey);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)pQVar33);
          pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,"-");
          pQVar23 = (QTextStream *)
                    QTextStream::operator<<(pQVar23,(QString *)(local_88.ptr + uVar38));
          QTextStream::operator<<(pQVar23,":");
          if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
            pQVar23 = (QTextStream *)QTextStream::operator<<(t," ");
            local_198.a.a = (QString *)0x0;
            local_198.a.b = (char (*) [2])0x0;
            local_198.b = (QString *)0x0;
            local_1d8.a.b = local_88.ptr + uVar38;
            local_1d8.a.a = (char (*) [2])0x2ae63f;
            local_1d8.b = (char (*) [2])0x2b1f52;
            QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]>::
            convertTo<QString>((QString *)local_1b8,&local_1d8);
            local_218._8_8_ = local_88.ptr + uVar38;
            local_218._0_8_ = "-";
            pMVar36 = (MakefileGenerator *)local_218;
            QStringBuilder<const_char_(&)[2],_const_QString_&>::convertTo<QString>
                      (&local_1f8,(QStringBuilder<const_char_(&)[2],_const_QString_&> *)pMVar36);
            valGlue((QString *)&rkey,pMVar36,&pSVar5->depends,(QString *)&local_198,
                    (QString *)local_1b8,&local_1f8);
            QTextStream::operator<<(pQVar23,(QString *)&rkey);
            t = (QTextStream *)pSVar34;
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                t = (QTextStream *)pSVar34;
              }
            }
            if ((Data *)local_1f8.d.d != (Data *)0x0) {
              LOCK();
              ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
              }
            }
            pSVar34 = (SequentialInstallData *)t;
            if ((Data *)local_1b8._0_8_ != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
              }
            }
            if ((Data *)local_198.a.a != (Data *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                  == 0) {
                QArrayData::deallocate((QArrayData *)local_198.a.a,2,0x10);
              }
            }
          }
          QTextStream::operator<<(t," FORCE");
          local_198.a.a = (QString *)local_118;
          local_198.a.b = (char (*) [2])0x2b1f52;
          local_198.b = &local_178;
          QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
          convertTo<QString>((QString *)&rkey,&local_198);
          writeSubTargetCall(this_01,t,(QString *)&rtkey,(QString *)local_158,&local_2a8.m_string,
                             &local_138,&local_f8,(QString *)&rkey);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if ((Span *)local_178.d.d != (Span *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
            }
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 < (ulong)local_88.size);
      }
      if (local_158 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158,2,0x10);
        }
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_118 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118,2,0x10);
        }
      }
      if ((Span *)local_f8.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)(this_00->d).size);
    Qt::endl(t);
    if (local_2c0 == (default_delete<SequentialInstallData> *)0x0) {
      uVar63 = CONCAT13(1,(int3)uVar63);
      local_2c0 = (default_delete<SequentialInstallData> *)0x0;
      goto LAB_0017ab24;
    }
    pQVar23 = (QTextStream *)QTextStream::operator<<(t,(QString *)local_2c0);
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,"install: FORCE");
    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)(local_2c0 + 0x18));
    pQVar23 = (QTextStream *)Qt::endl(pQVar23);
  }
  Qt::endl(pQVar23);
LAB_0017ab24:
  if ((in_ECX & 8) == 0) {
    writeMakeQmake(this_01,t,true);
    QTextStream::operator<<(t,"qmake_all:");
    if ((this_00->d).size != 0) {
      iVar24 = QList<MakefileGenerator::SubTarget_*>::begin(this_00);
      iVar25 = QList<MakefileGenerator::SubTarget_*>::end(this_00);
      if (iVar24.i != iVar25.i) {
        do {
          if (((*iVar24.i)->profile).d.size != 0) {
            pQVar23 = (QTextStream *)QTextStream::operator<<(t," ");
            pQVar23 = (QTextStream *)
                      QTextStream::operator<<(pQVar23,(QString *)&(*iVar24.i)->target);
            QTextStream::operator<<(pQVar23,"-qmake_all");
          }
          iVar24.i = iVar24.i + 1;
          iVar25 = QList<MakefileGenerator::SubTarget_*>::end(this_00);
        } while (iVar24.i != iVar25.i);
      }
    }
    QTextStream::operator<<(t," FORCE\n\n");
  }
  if (local_88.size != 0) {
    uVar37 = 0;
    do {
      local_2a8.m_string.d.d = local_88.ptr[uVar37].d.d;
      local_2a8.m_string.d.ptr = local_88.ptr[uVar37].d.ptr;
      local_2a8.m_string.d.size = local_88.ptr[uVar37].d.size;
      if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)((Span *)local_2a8.m_string.d.d)->offsets)->d).d =
             *(int *)&(((QString *)((Span *)local_2a8.m_string.d.d)->offsets)->d).d + 1;
        UNLOCK();
      }
      pSVar62 = pSVar34;
      if ((in_ECX & 1) == 0) {
        QVar54.m_data = (storage_type *)0x7;
        QVar54.m_size = (qsizetype)&rkey.super_ProString;
        QString::fromUtf8(QVar54);
        rtkey.super_ProString.m_string.d.d = rkey.super_ProString.m_string.d.d;
        rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
        rtkey.super_ProString.m_string.d.size = rkey.super_ProString.m_string.d.size;
        cVar21 = QString::endsWith((QString *)&local_2a8,(CaseSensitivity)&rtkey);
        if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        pSVar62 = pSVar34;
        if (cVar21 == '\0') goto LAB_0017acd0;
      }
      else {
LAB_0017acd0:
        pQVar23 = (QTextStream *)
                  QTextStream::operator<<((QTextStream *)pSVar62,(QString *)&local_2a8);
        QTextStream::operator<<(pQVar23,":");
        if ((this_00->d).size != 0) {
          uVar38 = 0;
          do {
            pSVar5 = (this_00->d).ptr[uVar38];
            pQVar4 = this_01->project;
            rtkey.super_ProString.m_string.d.ptr = L".CONFIG";
            rtkey.super_ProString.m_string.d.d = (Data *)pSVar5;
            ProString::ProString<QString&,char_const(&)[8]>
                      (&rkey.super_ProString,(QStringBuilder<QString_&,_const_char_(&)[8]> *)&rtkey)
            ;
            pQVar26 = &QMakeEvaluator::valuesRef
                                 (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                       super_QList<ProString>;
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            bVar20 = comparesEqual(&local_2a8.m_string,"make_first");
            if (((!bVar20) ||
                (qVar27 = QtPrivate::indexOf<ProString,char[18]>
                                    (pQVar26,(char (*) [18])"no_default_target",0), qVar27 == -1))
               && (((bVar20 = comparesEqual(&local_2a8.m_string,"install_subtargets"), !bVar20 &&
                    (bVar20 = comparesEqual(&local_2a8.m_string,"uninstall_subtargets"), !bVar20))
                   || (qVar27 = QtPrivate::indexOf<ProString,char[19]>
                                          (pQVar26,(char (*) [19])"no_default_install",0),
                      qVar27 == -1)))) {
              rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              rtkey.super_ProString.m_string.d.d = (Data *)&pSVar5->target;
              rtkey.super_ProString.m_string.d.ptr = L"-";
              rtkey.super_ProString.m_string.d.size = (qsizetype)&local_2a8;
              QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
              convertTo<QString>(&rkey.super_ProString.m_string,
                                 (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>
                                  *)&rtkey);
              if ((in_ECX & 2) != 0) {
                QString::append(&rkey.super_ProString,"-ordered",8);
              }
              pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62," ");
              QTextStream::operator<<(pQVar23,(QString *)&rkey.super_ProString);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            uVar38 = uVar38 + 1;
          } while (uVar38 < (ulong)(this_00->d).size);
        }
        bVar20 = comparesEqual(&local_2a8.m_string,"all");
        if ((bVar20) || (bVar20 = comparesEqual(&local_2a8.m_string,"make_first"), bVar20)) {
          pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"ALL_DEPS");
          depVar((QString *)&rtkey,this_01,(ProKey *)&rkey.super_ProString);
          QTextStream::operator<<(pQVar23,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        bVar20 = comparesEqual(&local_2a8.m_string,"clean");
        if (bVar20) {
          pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"CLEAN_DEPS");
          depVar((QString *)&rtkey,this_01,(ProKey *)&rkey.super_ProString);
          QTextStream::operator<<(pQVar23,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
joined_r0x0017b099:
          if (&(rkey.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          bVar20 = comparesEqual(&local_2a8.m_string,"distclean");
          if (bVar20) {
            pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar62,' ');
            ProKey::ProKey((ProKey *)&rkey.super_ProString,"DISTCLEAN_DEPS");
            depVar((QString *)&rtkey,this_01,(ProKey *)&rkey.super_ProString);
            QTextStream::operator<<(pQVar23,(QString *)&rtkey);
            if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            goto joined_r0x0017b099;
          }
        }
        pSVar34 = pSVar62;
        QTextStream::operator<<((QTextStream *)pSVar62," FORCE\n");
        bVar20 = comparesEqual(&local_2a8.m_string,"clean");
        if (bVar20) {
          ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_CLEAN");
          QVar55.m_data = (storage_type *)0xe;
          QVar55.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar55);
          local_f8.d.d = rtkey.super_ProString.m_string.d.d;
          local_f8.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          local_f8.d.size = rtkey.super_ProString.m_string.d.size;
          QVar56.m_data = (storage_type *)0xf;
          QVar56.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar56);
          local_118 = (undefined1  [8])rtkey.super_ProString.m_string.d.d;
          pcStack_110 = rtkey.super_ProString.m_string.d.ptr;
          local_108 = (undefined1 *)rtkey.super_ProString.m_string.d.size;
          QVar57.m_data = (storage_type *)0x1;
          QVar57.m_size = (qsizetype)&rtkey;
          QString::fromUtf8(QVar57);
          local_138.d.d = rtkey.super_ProString.m_string.d.d;
          local_138.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          local_138.d.size = rtkey.super_ProString.m_string.d.size;
          fixFileVarGlue((QString *)&rtkey,this_01,(ProKey *)&rkey.super_ProString,&local_f8,
                         (QString *)local_118,&local_138);
          QTextStream::operator<<((QTextStream *)pSVar62,(QString *)&rtkey);
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_118 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_118,2,0x10);
            }
          }
          if ((Span *)local_f8.d.d != (Span *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            iVar2 = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i;
            UNLOCK();
            pSVar32 = (Span *)rkey.super_ProString.m_string.d.d;
joined_r0x0017b55c:
            if (iVar2 == 0) {
              QArrayData::deallocate((QArrayData *)pSVar32,2,0x10);
            }
          }
        }
        else {
          bVar20 = comparesEqual(&local_2a8.m_string,"distclean");
          if (bVar20) {
            local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QFile::fileName();
            fileFixify(&local_f8,this_01,&rkey.super_ProString.m_string,(FileFixifyTypes)0x0,true);
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Span *)local_f8.d.size != (Span *)0x0) {
              pQVar23 = (QTextStream *)
                        QTextStream::operator<<((QTextStream *)pSVar34,"\t-$(DEL_FILE) ");
              (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                        (&rkey.super_ProString,this_01,&local_f8);
              pQVar23 = (QTextStream *)
                        QTextStream::operator<<(pQVar23,(QString *)&rkey.super_ProString);
              Qt::endl(pQVar23);
              if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
                LOCK();
                ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i =
                     ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate
                            (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            ProKey::ProKey((ProKey *)&rkey.super_ProString,"QMAKE_DISTCLEAN");
            QVar58.m_data = (storage_type *)0xe;
            QVar58.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar58);
            local_118 = (undefined1  [8])rtkey.super_ProString.m_string.d.d;
            pcStack_110 = rtkey.super_ProString.m_string.d.ptr;
            local_108 = (undefined1 *)rtkey.super_ProString.m_string.d.size;
            QVar59.m_data = (storage_type *)0x1;
            QVar59.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar59);
            local_138.d.d = rtkey.super_ProString.m_string.d.d;
            local_138.d.ptr = rtkey.super_ProString.m_string.d.ptr;
            local_138.d.size = rtkey.super_ProString.m_string.d.size;
            QVar60.m_data = (storage_type *)0x1;
            QVar60.m_size = (qsizetype)&rtkey;
            QString::fromUtf8(QVar60);
            local_158 = (undefined1  [8])rtkey.super_ProString.m_string.d.d;
            QStack_150.d = (Data *)rtkey.super_ProString.m_string.d.ptr;
            local_148 = rtkey.super_ProString.m_string.d.size;
            fixFileVarGlue((QString *)&rtkey,this_01,(ProKey *)&rkey.super_ProString,
                           (QString *)local_118,&local_138,(QString *)local_158);
            QTextStream::operator<<((QTextStream *)pSVar34,(QString *)&rtkey);
            if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_158 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_158,2,0x10);
              }
            }
            if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_118 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_118,2,0x10);
              }
            }
            if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
              LOCK();
              ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate
                          (&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
              }
            }
            if ((Span *)local_f8.d.d != (Span *)0x0) {
              LOCK();
              ((__atomic_base<int> *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d)->_M_i =
                   ((__atomic_base<int> *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d)->
                   _M_i + -1;
              iVar2 = ((__atomic_base<int> *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d)
                      ->_M_i;
              UNLOCK();
              pSVar32 = (Span *)local_f8.d.d;
              goto joined_r0x0017b55c;
            }
          }
        }
      }
      if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (ulong)local_88.size);
  }
  pQVar4 = this_01->project;
  ProKey::ProKey(&rkey,"QMAKE_EXTRA_TARGETS");
  pPVar22 = QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rkey);
  if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar22->super_QList<ProString>).d.size != 0) {
    pSVar32 = (Span *)(pPVar22->super_QList<ProString>).d.ptr;
    pSVar62 = pSVar34;
    do {
      pQVar4 = this_01->project;
      rtkey.super_ProString.m_string.d.ptr = L".CONFIG";
      rtkey.super_ProString.m_string.d.d = (Data *)pSVar32;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
      pQVar26 = &QMakeEvaluator::valuesRef
                           (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString)->
                 super_QList<ProString>;
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_f8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      rtkey.super_ProString.m_string.d.ptr = L".target";
      rtkey.super_ProString.m_string.d.d = (Data *)pSVar32;
      ProString::ProString<ProString_const&,char_const(&)[8]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&rtkey);
      (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                (&local_f8,this_01,&rkey.super_ProString);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_108 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pcStack_110 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      rtkey.super_ProString.m_string.d.ptr = L".commands";
      rtkey.super_ProString.m_string.d.d = (Data *)pSVar32;
      ProString::ProString<ProString_const&,char_const(&)[10]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)&rtkey);
      (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                (local_118,this_01,&rkey.super_ProString);
      pSVar34 = pSVar62;
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_138.d.d = (Data *)0x0;
      local_138.d.ptr = (char16_t *)0x0;
      local_138.d.size = 0;
      if ((Span *)local_f8.d.size == (Span *)0x0) {
        ProString::toQString(&rkey.super_ProString.m_string,(ProString *)pSVar32);
        qVar27 = rkey.super_ProString.m_string.d.size;
        pDVar17 = rkey.super_ProString.m_string.d.d;
        pcVar11 = local_f8.d.ptr;
        pDVar10 = local_f8.d.d;
        rkey.super_ProString.m_string.d.d = local_f8.d.d;
        pSVar8 = (SourceFiles *)local_f8.d.ptr;
        pSVar9 = (Span *)local_f8.d.size;
        local_f8.d.d = pDVar17;
        local_f8.d.ptr = rkey.super_ProString.m_string.d.ptr;
        pSVar7 = (Span *)rkey.super_ProString.m_string.d.size;
        rkey.super_ProString.m_string.d.ptr = pcVar11;
        rkey.super_ProString.m_string.d.size = local_f8.d.size;
        local_f8.d.size = qVar27;
        if ((Span *)pDVar10 != (Span *)0x0) {
          LOCK();
          *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d =
               *(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)&pDVar10->super_QArrayData)->d).d == 0) {
            QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
          }
        }
      }
      Qt::endl((QTextStream *)pSVar62);
      pQVar4 = this_01->project;
      rtkey.super_ProString.m_string.d.ptr = L".depends";
      rtkey.super_ProString.m_string.d.d = (Data *)pSVar32;
      ProString::ProString<ProString_const&,char_const(&)[9]>
                (&rkey.super_ProString,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
      pPVar28 = QMakeEvaluator::valuesRef
                          (&pQVar4->super_QMakeEvaluator,(ProKey *)&rkey.super_ProString);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((pPVar28->super_QList<ProString>).d.size != 0) {
        pPVar39 = (pPVar28->super_QList<ProString>).d.ptr;
        do {
          rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_2a8.m_string.d.ptr = L".target";
          local_2a8.m_string.d.d = (Data *)pPVar39;
          ProString::ProString<ProString_const&,char_const(&)[8]>
                    (&rkey.super_ProString,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_2a8);
          (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])
                    ((QArrayDataPointer<QString> *)&rtkey,this_01,&rkey.super_ProString);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (rtkey.super_ProString.m_string.d.size == 0) {
            ProString::toQString((QString *)&rkey,pPVar39);
            qVar27 = rkey.super_ProString.m_string.d.size;
            pDVar17 = rkey.super_ProString.m_string.d.d;
            pcVar11 = rtkey.super_ProString.m_string.d.ptr;
            pDVar10 = rtkey.super_ProString.m_string.d.d;
            rkey.super_ProString.m_string.d.d = rtkey.super_ProString.m_string.d.d;
            rtkey.super_ProString.m_string.d.d = pDVar17;
            rtkey.super_ProString.m_string.d.ptr = rkey.super_ProString.m_string.d.ptr;
            rkey.super_ProString.m_string.d.ptr = pcVar11;
            rkey.super_ProString.m_string.d.size = rtkey.super_ProString.m_string.d.size;
            rtkey.super_ProString.m_string.d.size = qVar27;
            if (pDVar10 != (Data *)0x0) {
              LOCK();
              (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
              }
            }
          }
          rkey.super_ProString.m_string.d.d = rtkey.super_ProString.m_string.d.d;
          rkey.super_ProString.m_string.d.ptr = rtkey.super_ProString.m_string.d.ptr;
          rkey.super_ProString.m_string.d.size = rtkey.super_ProString.m_string.d.size;
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          string.d.ptr = (char16_t *)pSVar34;
          string.d.d = (Data *)this_01;
          string.d.size._0_4_ = in_ECX;
          string.d.size._4_4_ = uVar63;
          Option::fixString((QString *)local_158,string,(uchar)&rkey);
          if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])
                    (&local_2a8,this_01,(QString *)local_158);
          qVar27 = local_2a8.m_string.d.size;
          rkey.super_ProString.m_string.d.size = (qsizetype)local_2a8.m_string.d.ptr;
          rkey.super_ProString.m_string.d.ptr = (char16_t *)local_2a8.m_string.d.d;
          rkey.super_ProString.m_string.d.d =
               (Data *)CONCAT71(rkey.super_ProString.m_string.d.d._1_7_,0x20);
          local_2a8.m_string.d.d = (Data *)0x0;
          local_2a8.m_string.d.ptr = (char16_t *)0x0;
          local_2a8.m_string.d.size = 0;
          qVar12 = local_2a8.m_string.d.size;
          local_2a8.m_string.d.size._0_4_ = (undefined4)qVar27;
          local_2a8.m_string.d.size._4_4_ = SUB84(qVar27,4);
          rkey.super_ProString.m_offset = (undefined4)local_2a8.m_string.d.size;
          rkey.super_ProString.m_length = local_2a8.m_string.d.size._4_4_;
          local_2a8.m_string.d.size = qVar12;
          ::operator+=(&local_138,(QStringBuilder<char,_QString> *)&rkey);
          if (rkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
            LOCK();
            *(int *)rkey.super_ProString.m_string.d.ptr =
                 *(int *)rkey.super_ProString.m_string.d.ptr + -1;
            UNLOCK();
            if (*(int *)rkey.super_ProString.m_string.d.ptr == 0) {
              QArrayData::deallocate((QArrayData *)rkey.super_ProString.m_string.d.ptr,2,0x10);
            }
          }
          if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_158 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_158,2,0x10);
            }
          }
          if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
              ;
            }
          }
          pPVar39 = pPVar39 + 1;
        } while (pPVar39 !=
                 (pPVar28->super_QList<ProString>).d.ptr + (pPVar28->super_QList<ProString>).d.size)
        ;
      }
      qVar27 = QtPrivate::indexOf<ProString,char[10]>(pQVar26,(char (*) [10])0x2b8c4a,0);
      if (qVar27 != -1) {
        local_200.d = (Data *)0x0;
        rkey.super_ProString._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        rkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        rtkey.super_ProString.m_string.d.ptr = L".recurse";
        rtkey.super_ProString.m_string.d.d = (Data *)pSVar32;
        ProString::ProString<ProString_const&,char_const(&)[9]>
                  (&rkey.super_ProString,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)&rtkey);
        p_Var6 = (this_01->project->super_QMakeEvaluator).m_valuemapStack.
                 super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 .
                 super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
        lVar40 = (long)p_Var6[1]._M_next;
        if ((lVar40 == 0) ||
           (cVar29 = std::
                     _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                     ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                             *)(lVar40 + 8),(key_type *)&rkey.super_ProString),
           cVar29._M_node == (_Base_ptr)((long)p_Var6[1]._M_next + 0x10))) {
          if ((this_00->d).size != 0) {
            uVar37 = 0;
            do {
              QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QString,QHashDummyValue> *)&local_200,
                         &(this_00->d).ptr[uVar37]->name,(QHashDummyValue *)&rtkey);
              uVar37 = uVar37 + 1;
              uVar38 = (this_00->d).size;
            } while (uVar37 < uVar38);
            goto LAB_0017bcd2;
          }
        }
        else {
          rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          pPVar28 = QMakeEvaluator::valuesRef
                              (&this_01->project->super_QMakeEvaluator,
                               (ProKey *)&rkey.super_ProString);
          ProStringList::toQStringList((QStringList *)&rtkey,pPVar28);
          qVar27 = rtkey.super_ProString.m_string.d.size;
          pQVar33 = (QString *)rtkey.super_ProString.m_string.d.ptr;
          local_158 = (undefined1  [8])0x0;
          QHash<QString,_QHashDummyValue>::reserve
                    ((QHash<QString,_QHashDummyValue> *)local_158,
                     rtkey.super_ProString.m_string.d.size);
          if (qVar27 != 0) {
            lVar40 = qVar27 * 0x18;
            do {
              QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                        ((QHash<QString,QHashDummyValue> *)local_158,pQVar33,
                         (QHashDummyValue *)&local_2a8);
              pQVar33 = pQVar33 + 1;
              lVar40 = lVar40 + -0x18;
            } while (lVar40 != 0);
          }
          auVar18 = local_158;
          local_2a8.m_string.d.d = (Data *)local_200.d;
          local_158 = (undefined1  [8])0x0;
          local_200.d = (Data *)auVar18;
          QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)&local_2a8);
          QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)local_158);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&rtkey);
          uVar38 = (this_00->d).size;
LAB_0017bcd2:
          if (uVar38 != 0) {
            uVar37 = 0;
            do {
              pSVar5 = (this_00->d).ptr[uVar37];
              local_158 = (undefined1  [8])(pSVar5->in_directory).d.d;
              QStack_150.d = (Data *)(pSVar5->in_directory).d.ptr;
              local_148 = (pSVar5->in_directory).d.size;
              if (local_158 != (undefined1  [8])0x0) {
                LOCK();
                (((QArrayData *)&((Data *)local_158)->ref)->ref_)._q_value.super___atomic_base<int>.
                _M_i = (((QArrayData *)&((Data *)local_158)->ref)->ref_)._q_value.
                       super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              if ((local_148 != 0) &&
                 (cVar21 = QString::endsWith((QString *)local_158,0x2e5bf0), cVar21 == '\0')) {
                QString::append((QString *)local_158);
              }
              local_178.d.d = (pSVar5->out_directory).d.d;
              local_178.d.ptr = (pSVar5->out_directory).d.ptr;
              local_178.d.size = (pSVar5->out_directory).d.size;
              if ((Span *)local_178.d.d != (Span *)0x0) {
                LOCK();
                (((Type *)&(((QString *)((Span *)local_178.d.d)->offsets)->d).d)->
                super___atomic_base<int>)._M_i =
                     (((Type *)&(((QString *)((Span *)local_178.d.d)->offsets)->d).d)->
                     super___atomic_base<int>)._M_i + 1;
                UNLOCK();
              }
              if (((Span *)local_178.d.size != (Span *)0x0) &&
                 (cVar21 = QString::endsWith((QString *)&local_178,0x2e5bf0), cVar21 == '\0')) {
                QString::append((QString *)&local_178);
              }
              if (((undefined1 *)local_a8.d.size != (undefined1 *)0x0) &&
                 (cVar21 = QString::startsWith((QString *)&local_178,(CaseSensitivity)&local_a8),
                 cVar21 != '\0')) {
                QString::mid((longlong)&local_198,(longlong)&local_178);
                rtkey.super_ProString._24_8_ = local_198.b;
                rtkey.super_ProString.m_string.d.size = (qsizetype)local_198.a.b;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_198.a.a;
                rtkey.super_ProString.m_string.d.d = (Data *)&Option::output_dir;
                local_198.a.a = (QString *)0x0;
                local_198.a.b = (char (*) [2])0x0;
                local_198.b = (QString *)0x0;
                QStringBuilder<QString_&,_QString>::convertTo<QString>
                          (&local_2a8.m_string,(QStringBuilder<QString_&,_QString> *)&rtkey);
                pcVar11 = local_178.d.ptr;
                pDVar17 = local_178.d.d;
                qVar27 = local_2a8.m_string.d.size;
                pDVar10 = local_2a8.m_string.d.d;
                local_2a8.m_string.d.d = local_178.d.d;
                local_178.d.d = pDVar10;
                local_178.d.ptr = local_2a8.m_string.d.ptr;
                local_2a8.m_string.d.ptr = pcVar11;
                local_2a8.m_string.d.size = local_178.d.size;
                local_178.d.size = qVar27;
                if ((Span *)pDVar17 != (Span *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&pDVar17->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&pDVar17->super_QArrayData)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)&pDVar17->super_QArrayData)->d).d == 0) {
                    QArrayData::deallocate(&pDVar17->super_QArrayData,2,0x10);
                  }
                }
                pcVar11 = rtkey.super_ProString.m_string.d.ptr;
                if (rtkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
                  LOCK();
                  *(int *)rtkey.super_ProString.m_string.d.ptr =
                       *(int *)rtkey.super_ProString.m_string.d.ptr + -1;
                  UNLOCK();
                  if (*(int *)pcVar11 == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)rtkey.super_ProString.m_string.d.ptr,2,0x10);
                  }
                }
                if ((Data *)local_198.a.a != (Data *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                       = (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_198.a.a,2,0x10);
                  }
                }
              }
              if (((Span *)local_200.d != (Span *)0x0) &&
                 (pNVar30 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                            findNode<QString>(local_200.d,&pSVar5->name),
                 pNVar30 != (Node<QString,_QHashDummyValue> *)0x0)) {
                local_198.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                local_198.a.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                local_198.a.b = (char (*) [2])&DAT_aaaaaaaaaaaaaaaa;
                if ((Span *)local_178.d.size == (Span *)0x0) {
                  QVar61.m_data = (storage_type *)0x2;
                  QVar61.m_size = (qsizetype)&rtkey;
                  QString::fromUtf8(QVar61);
                  local_198.a.a = (QString *)rtkey.super_ProString.m_string.d.d;
                  local_198.a.b = (char (*) [2])rtkey.super_ProString.m_string.d.ptr;
                  local_198.b = (QString *)rtkey.super_ProString.m_string.d.size;
                }
                else {
                  (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&local_2a8,this_01,&local_178);
                  qVar27 = local_2a8.m_string.d.size;
                  rtkey.super_ProString.m_string.d.size = (qsizetype)local_2a8.m_string.d.ptr;
                  rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_2a8.m_string.d.d;
                  local_2a8.m_string.d.size = 0;
                  qVar12 = local_2a8.m_string.d.size;
                  rtkey.super_ProString.m_string.d.d = (Data *)anon_var_dwarf_156f16;
                  local_2a8.m_string.d.d = (Data *)0x0;
                  local_2a8.m_string.d.ptr = (char16_t *)0x0;
                  local_2a8.m_string.d.size._0_4_ = (undefined4)qVar27;
                  local_2a8.m_string.d.size._4_4_ = SUB84(qVar27,4);
                  rtkey.super_ProString.m_offset = (undefined4)local_2a8.m_string.d.size;
                  rtkey.super_ProString.m_length = local_2a8.m_string.d.size._4_4_;
                  rtkey.super_ProString._32_8_ = (long)" ) && " + 2;
                  local_2a8.m_string.d.size = qVar12;
                  QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
                  convertTo<QString>((QString *)&local_198,
                                     (QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                                      *)&rtkey);
                  if (rtkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
                    LOCK();
                    *(int *)rtkey.super_ProString.m_string.d.ptr =
                         *(int *)rtkey.super_ProString.m_string.d.ptr + -1;
                    UNLOCK();
                    if (*(int *)rtkey.super_ProString.m_string.d.ptr == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)rtkey.super_ProString.m_string.d.ptr,2,0x10);
                    }
                  }
                  if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
                local_1b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_1b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                          (&local_2a8,this_01,&pSVar5->makefile);
                qVar27 = local_2a8.m_string.d.size;
                rtkey.super_ProString.m_string.d.size = (qsizetype)local_2a8.m_string.d.ptr;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)local_2a8.m_string.d.d;
                rtkey.super_ProString.m_string.d.d = (Data *)0x2ae87e;
                local_2a8.m_string.d.d = (Data *)0x0;
                local_2a8.m_string.d.ptr = (char16_t *)0x0;
                local_2a8.m_string.d.size = 0;
                qVar12 = local_2a8.m_string.d.size;
                local_2a8.m_string.d.size._0_4_ = (undefined4)qVar27;
                local_2a8.m_string.d.size._4_4_ = SUB84(qVar27,4);
                rtkey.super_ProString.m_offset = (undefined4)local_2a8.m_string.d.size;
                rtkey.super_ProString.m_length = local_2a8.m_string.d.size._4_4_;
                local_2a8.m_string.d.size = qVar12;
                QStringBuilder<const_char_(&)[5],_QString>::convertTo<QString>
                          ((QString *)local_1b8,(QStringBuilder<const_char_(&)[5],_QString> *)&rtkey
                          );
                if (rtkey.super_ProString.m_string.d.ptr != (char16_t *)0x0) {
                  LOCK();
                  *(int *)rtkey.super_ProString.m_string.d.ptr =
                       *(int *)rtkey.super_ProString.m_string.d.ptr + -1;
                  UNLOCK();
                  if (*(int *)rtkey.super_ProString.m_string.d.ptr == 0) {
                    QArrayData::deallocate
                              ((QArrayData *)rtkey.super_ProString.m_string.d.ptr,2,0x10);
                  }
                }
                if (&(local_2a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                local_1d8.b = (char (*) [2])0x0;
                local_1d8.a.a = (char (*) [2])0x0;
                local_1d8.a.b = (QString *)0x0;
                local_1f8.d.size = 0;
                local_1f8.d.d = (Data *)0x0;
                local_1f8.d.ptr = (char16_t *)0x0;
                if ((pSVar5->profile).d.size != 0) {
                  QString::operator=((QString *)&local_1d8,(QString *)&pSVar5->makefile);
                  local_238.a.a = (QString *)local_158;
                  local_238.a.b = (char (*) [2])&pSVar5->profile;
                  QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                            ((QString *)local_218,(QStringBuilder<QString_&,_QString_&> *)&local_238
                            );
                  pMVar36 = this_01;
                  fileFixify(&local_2a8.m_string,this_01,(QString *)local_218,(FileFixifyTypes)0x4,
                             true);
                  (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&rtkey,this_01,&local_2a8);
                  qVar27 = rtkey.super_ProString.m_string.d.size;
                  pDVar17 = rtkey.super_ProString.m_string.d.d;
                  pcVar11 = local_1f8.d.ptr;
                  pDVar10 = local_1f8.d.d;
                  rtkey.super_ProString.m_string.d.d = local_1f8.d.d;
                  local_1f8.d.d = pDVar17;
                  local_1f8.d.ptr = rtkey.super_ProString.m_string.d.ptr;
                  rtkey.super_ProString.m_string.d.ptr = pcVar11;
                  rtkey.super_ProString.m_string.d.size = local_1f8.d.size;
                  local_1f8.d.size = qVar27;
                  this_01 = pMVar36;
                  if ((Data *)pDVar10 != (Data *)0x0) {
                    LOCK();
                    (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
                       ) {
                      QArrayData::deallocate(&pDVar10->super_QArrayData,2,0x10);
                      this_01 = pMVar36;
                    }
                  }
                  if (&(local_2a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if ((Span *)local_218._0_8_ != (Span *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)local_218._0_8_)->d).d =
                         *(int *)&(((QString *)local_218._0_8_)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)local_218._0_8_)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
                    }
                  }
                  cVar21 = QString::startsWith((QString *)&local_1d8,(CaseSensitivity)local_158);
                  if (cVar21 != '\0') {
                    QString::mid((longlong)&rtkey,(longlong)&local_1d8);
                    qVar27 = rtkey.super_ProString.m_string.d.size;
                    pDVar10 = rtkey.super_ProString.m_string.d.d;
                    pQVar33 = local_1d8.a.b;
                    pacVar16 = local_1d8.a.a;
                    rtkey.super_ProString.m_string.d.d = (Data *)local_1d8.a.a;
                    local_1d8.a.a = (char (*) [2])pDVar10;
                    local_1d8.a.b = (QString *)rtkey.super_ProString.m_string.d.ptr;
                    rtkey.super_ProString.m_string.d.ptr = (char16_t *)pQVar33;
                    rtkey.super_ProString.m_string.d.size = (qsizetype)local_1d8.b;
                    local_1d8.b = (char (*) [2])qVar27;
                    if ((QArrayData *)pacVar16 != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i =
                           (((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i
                           + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i
                          == 0) {
                        QArrayData::deallocate((QArrayData *)pacVar16,2,0x10);
                      }
                    }
                  }
                  (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xc])
                            (&rtkey,this_01,&local_1d8);
                  qVar27 = rtkey.super_ProString.m_string.d.size;
                  pDVar10 = rtkey.super_ProString.m_string.d.d;
                  pQVar33 = local_1d8.a.b;
                  pacVar16 = local_1d8.a.a;
                  rtkey.super_ProString.m_string.d.d = (Data *)local_1d8.a.a;
                  local_1d8.a.a = (char (*) [2])pDVar10;
                  local_1d8.a.b = (QString *)rtkey.super_ProString.m_string.d.ptr;
                  rtkey.super_ProString.m_string.d.ptr = (char16_t *)pQVar33;
                  rtkey.super_ProString.m_string.d.size = (qsizetype)local_1d8.b;
                  local_1d8.b = (char (*) [2])qVar27;
                  if ((QArrayData *)pacVar16 != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i +
                         -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)*pacVar16)->_q_value).super___atomic_base<int>._M_i ==
                        0) {
                      QArrayData::deallocate((QArrayData *)pacVar16,2,0x10);
                    }
                  }
                }
                if ((in_ECX & 2) == 0) {
                  rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  local_2a8.m_string.d.ptr = L"-";
                  local_2a8.m_string.d.d = (Data *)&pSVar5->target;
                  local_2a8.m_string.d.size = (qsizetype)pSVar32;
                  QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>::
                  convertTo<QString>((QString *)&rtkey,
                                     (QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>
                                      *)&local_2a8);
                  pQVar23 = (QTextStream *)
                            QTextStream::operator<<((QTextStream *)pSVar34,(QString *)&rtkey);
                  QTextStream::operator<<(pQVar23,":");
                  if ((pSVar5->depends).super_QList<ProString>.d.size != 0) {
                    pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar34," ");
                    local_218._0_8_ = (Span *)0x0;
                    local_218._8_8_ = (SourceFiles *)0x0;
                    local_218._16_8_ = (Span *)0x0;
                    local_250.a.a = (char (*) [2])0x2ae63f;
                    local_250.b = (char (*) [2])0x2b1f52;
                    local_250.a.b = (ProString *)pSVar32;
                    QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]>
                    ::convertTo<QString>((QString *)&local_238,&local_250);
                    local_278._0_8_ = "-";
                    pMVar36 = (MakefileGenerator *)local_278;
                    local_278._8_8_ = pSVar32;
                    QStringBuilder<const_char_(&)[2],_const_ProString_&>::convertTo<QString>
                              ((QString *)(local_278 + 0x10),
                               (QStringBuilder<const_char_(&)[2],_const_ProString_&> *)pMVar36);
                    valGlue(&local_2a8.m_string,pMVar36,&pSVar5->depends,(QString *)local_218,
                            (QString *)&local_238,(QString *)(local_278 + 0x10));
                    QTextStream::operator<<(pQVar23,(QString *)&local_2a8);
                    if (&(local_2a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i =
                           ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                          super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if ((QArrayData *)local_278._16_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_278._16_8_)->_q_value).super___atomic_base<int>.
                      _M_i = (((QBasicAtomicInt *)local_278._16_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_278._16_8_)->_q_value).super___atomic_base<int>
                          ._M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_278._16_8_,2,0x10);
                      }
                    }
                    if ((Span *)local_238.a.a != (Span *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)&(local_238.a.a)->d)->d).d =
                           *(int *)&(((QString *)&(local_238.a.a)->d)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)&(local_238.a.a)->d)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)local_238.a.a,2,0x10);
                      }
                    }
                    if ((Span *)local_218._0_8_ != (Span *)0x0) {
                      LOCK();
                      *(int *)&(((QString *)local_218._0_8_)->d).d =
                           *(int *)&(((QString *)local_218._0_8_)->d).d + -1;
                      UNLOCK();
                      if (*(int *)&(((QString *)local_218._0_8_)->d).d == 0) {
                        QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
                      }
                    }
                  }
                  local_2a8.m_string.d.d = (Data *)0x2b1f52;
                  local_2a8.m_string.d.ptr = (char16_t *)&rtkey;
                  ::operator+=(&local_138,
                               (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&local_2a8);
                  if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
                    LOCK();
                    ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate
                                (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                else {
                  local_2a8.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_2a8.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_2a8.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                  rtkey.super_ProString.m_string.d.ptr = L"-";
                  rtkey.super_ProString._24_8_ = anon_var_dwarf_157034;
                  rtkey.super_ProString.m_string.d.d = (Data *)&pSVar5->target;
                  rtkey.super_ProString.m_string.d.size = (qsizetype)pSVar32;
                  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                  ::convertTo<QString>
                            (&local_2a8.m_string,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                              *)&rtkey);
                  pSVar62 = pSVar34;
                  pQVar23 = (QTextStream *)
                            QTextStream::operator<<((QTextStream *)pSVar34,(QString *)&local_2a8);
                  QTextStream::operator<<(pQVar23,":");
                  if (uVar37 != 0) {
                    pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar34," ");
                    pQVar23 = (QTextStream *)
                              QTextStream::operator<<
                                        (pQVar23,(QString *)&(this_00->d).ptr[uVar37 - 1]->target);
                    pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,"-");
                    pQVar23 = operator<<(pQVar23,(ProString *)pSVar32);
                    QTextStream::operator<<(pQVar23,"_ordered ");
                  }
                  pSVar34 = pSVar62;
                  rtkey.super_ProString.m_string.d.d = (Data *)0x2b1f52;
                  rtkey.super_ProString.m_string.d.ptr = (char16_t *)&local_2a8;
                  ::operator+=(&local_138,
                               (QStringBuilder<const_char_(&)[2],_const_QString_&> *)&rtkey);
                  if (&(local_2a8.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i =
                         ((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                         super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_2a8.m_string.d.d)->super_QArrayData).ref_._q_value.
                        super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                local_218._0_8_ = local_f8.d.d;
                local_218._8_8_ = local_f8.d.ptr;
                local_218._16_8_ = local_f8.d.size;
                if ((Span *)local_f8.d.d != (Span *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + 1;
                  UNLOCK();
                }
                rtkey.super_ProString._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                rtkey.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                local_2a8.m_string.d.ptr = L".recurse_target";
                local_2a8.m_string.d.d = (Data *)pSVar32;
                ProString::ProString<ProString_const&,char_const(&)[16]>
                          (&rtkey.super_ProString,
                           (QStringBuilder<const_ProString_&,_const_char_(&)[16]> *)&local_2a8);
                p_Var6 = (this_01->project->super_QMakeEvaluator).m_valuemapStack.
                         super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         .
                         super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next;
                lVar40 = (long)p_Var6[1]._M_next;
                if ((lVar40 != 0) &&
                   (cVar29 = std::
                             _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                             ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                                     *)(lVar40 + 8),&rtkey),
                   cVar29._M_node != (_Base_ptr)((long)p_Var6[1]._M_next + 0x10))) {
                  QMakeEvaluator::first(&local_2a8,&this_01->project->super_QMakeEvaluator,&rtkey);
                  ProString::toQString((QString *)&local_238,&local_2a8);
                  uVar15 = local_218._8_8_;
                  uVar14 = local_218._0_8_;
                  pQVar13 = local_238.b;
                  pQVar33 = local_238.a.a;
                  local_238.a.a = (QString *)local_218._0_8_;
                  local_218._0_8_ = pQVar33;
                  local_218._8_8_ = local_238.a.b;
                  local_238.a.b = (char (*) [2])uVar15;
                  local_238.b = (QString *)local_218._16_8_;
                  local_218._16_8_ = pQVar13;
                  if ((Span *)uVar14 != (Span *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)uVar14)->d).d = *(int *)&(((QString *)uVar14)->d).d + -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)uVar14)->d).d == 0) {
                      QArrayData::deallocate((QArrayData *)uVar14,2,0x10);
                    }
                  }
                  if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
                    LOCK();
                    *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                         *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d +
                         -1;
                    UNLOCK();
                    if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d ==
                        0) {
                      QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                local_238.a.a = (QString *)local_1b8;
                local_238.a.b = (char (*) [2])0x2b1f52;
                local_238.b = (QString *)local_218;
                QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>::
                convertTo<QString>(&local_2a8.m_string,&local_238);
                writeSubTargetCall(this_01,(QTextStream *)pSVar34,(QString *)local_158,&local_1f8,
                                   &local_178,(QString *)&local_1d8,(QString *)&local_198,
                                   &local_2a8.m_string);
                if ((Span *)local_2a8.m_string.d.d != (Span *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d =
                       *(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d + -1
                  ;
                  UNLOCK();
                  if (*(int *)&(((QString *)&(local_2a8.m_string.d.d)->super_QArrayData)->d).d == 0)
                  {
                    QArrayData::deallocate(&(local_2a8.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
                  LOCK();
                  ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                  super___atomic_base<int>._M_i =
                       ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                      super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate
                              (&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((Span *)local_218._0_8_ != (Span *)0x0) {
                  LOCK();
                  *(int *)&(((QString *)local_218._0_8_)->d).d =
                       *(int *)&(((QString *)local_218._0_8_)->d).d + -1;
                  UNLOCK();
                  if (*(int *)&(((QString *)local_218._0_8_)->d).d == 0) {
                    QArrayData::deallocate((QArrayData *)local_218._0_8_,2,0x10);
                  }
                }
                if ((Data *)local_1f8.d.d != (Data *)0x0) {
                  LOCK();
                  ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_1f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_1f8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if ((QArrayData *)local_1d8.a.a != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)*local_1d8.a.a)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)*local_1d8.a.a)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)*local_1d8.a.a)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_1d8.a.a,2,0x10);
                  }
                }
                if ((Data *)local_1b8._0_8_ != (Data *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_1b8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_1b8._0_8_,2,0x10);
                  }
                }
                if ((Data *)local_198.a.a != (Data *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>._M_i
                       = (((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).
                         super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)&(local_198.a.a)->d)->_q_value).super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_198.a.a,2,0x10);
                  }
                }
              }
              if ((Span *)local_178.d.d != (Span *)0x0) {
                LOCK();
                *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d =
                     *(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)&(local_178.d.d)->super_QArrayData)->d).d == 0) {
                  QArrayData::deallocate(&(local_178.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_158 != (undefined1  [8])0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_158)->_q_value).super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_158,2,0x10);
                }
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 < (ulong)(this_00->d).size);
          }
        }
        if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        QHash<QString,_QHashDummyValue>::~QHash(&local_200);
      }
      qVar27 = QtPrivate::indexOf<ProString,char[6]>(pQVar26,(char (*) [6])"phony",0);
      pSVar62 = pSVar34;
      if (qVar27 != -1) {
        QString::append(&local_138," FORCE",6);
      }
      rkey.super_ProString.m_string.d.d = local_f8.d.d;
      rkey.super_ProString.m_string.d.ptr = local_f8.d.ptr;
      rkey.super_ProString.m_string.d.size = local_f8.d.size;
      if ((Span *)local_f8.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + 1;
        UNLOCK();
      }
      string_00.d.ptr = (char16_t *)pSVar62;
      string_00.d.d = (Data *)this_01;
      string_00.d.size._0_4_ = in_ECX;
      string_00.d.size._4_4_ = uVar63;
      Option::fixString((QString *)&rtkey,string_00,(uchar)&rkey);
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0xd])(&rkey,this_01,&rtkey);
      pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar34,(QString *)&rkey);
      pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,":");
      pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)&local_138);
      QTextStream::operator<<(pQVar23,"\n");
      if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_108 != (undefined1 *)0x0) {
        pQVar23 = (QTextStream *)QTextStream::operator<<((QTextStream *)pSVar34,"\t");
        pQVar23 = (QTextStream *)QTextStream::operator<<(pQVar23,(QString *)local_118);
        Qt::endl(pQVar23);
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_118 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_118)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_118,2,0x10);
        }
      }
      if ((Span *)local_f8.d.d != (Span *)0x0) {
        LOCK();
        *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d =
             *(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&(local_f8.d.d)->super_QArrayData)->d).d == 0) {
          QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
        }
      }
      pSVar32 = (Span *)((QString *)pSVar32->offsets + 2);
    } while (pSVar32 !=
             (Span *)((pPVar22->super_QList<ProString>).d.ptr +
                     (pPVar22->super_QList<ProString>).d.size));
  }
  cVar21 = (char)((uint)uVar63 >> 0x18);
  if ((in_ECX & 1) != 0) {
    ProString::ProString(&rkey.super_ProString,"install_subtargets");
    pQVar4 = this_01->project;
    ProKey::ProKey(&rtkey,"INSTALLDEPS");
    pQVar26 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar26,(pQVar26->d).size,&rkey.super_ProString);
    QList<ProString>::end(pQVar26);
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ProString::ProString(&rkey.super_ProString,"uninstall_subtargets");
    pQVar4 = this_01->project;
    ProKey::ProKey(&rtkey,"UNINSTALLDEPS");
    pQVar26 = &QMakeEvaluator::valuesRef(&pQVar4->super_QMakeEvaluator,&rtkey)->
               super_QList<ProString>;
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar26,(pQVar26->d).size,&rkey.super_ProString);
    QList<ProString>::end(pQVar26);
    if (rtkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rtkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rtkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (rkey.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((rkey.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(rkey.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    writeInstalls(this_01,(QTextStream *)pSVar34,true);
  }
  QTextStream::operator<<((QTextStream *)pSVar34,"FORCE:\n\n");
  (*(this_01->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[7])();
  if (cVar21 == '\0') {
    std::default_delete<SequentialInstallData>::operator()(local_2c0,pSVar34);
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    // blasted includes
    const ProStringList &qeui = project->values("QMAKE_EXTRA_INCLUDES");
    for (ProStringList::ConstIterator qeui_it = qeui.begin(); qeui_it != qeui.end(); ++qeui_it)
        t << "include " << (*qeui_it) << Qt::endl;

    if (!(flags & SubTargetSkipDefaultVariables)) {
        writeDefaultVariables(t);
        t << "SUBTARGETS    = ";     // subtargets are sub-directory
        for(int target = 0; target < targets.size(); ++target)
            t << " \\\n\t\t" << targets.at(target)->target;
        t << Qt::endl << Qt::endl;
    }
    writeExtraVariables(t);

    QStringList targetSuffixes;
    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    if (!(flags & SubTargetSkipDefaultTargets)) {
        targetSuffixes << "make_first" << "all" << "clean" << "distclean"
                       << QString((flags & SubTargetInstalls) ? "install_subtargets" : "install")
                       << QString((flags & SubTargetInstalls) ? "uninstall_subtargets" : "uninstall");
    }

    struct SequentialInstallData
    {
        QString targetPrefix;
        QString commands;
        QTextStream commandsStream;
        SequentialInstallData() : commandsStream(&commands) {}
    };
    std::unique_ptr<SequentialInstallData> sequentialInstallData;
    bool dont_recurse = project->isActiveConfig("dont_recurse");

    // generate target rules
    for(int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

        //qmake it
        QString out;
        QString in;
        if(!subtarget->profile.isEmpty()) {
            out = subtarget->makefile;
            in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
            if(out.startsWith(in_directory))
                out = out.mid(in_directory.size());
            out = escapeFilePath(out);
            t << subtarget->target << "-qmake_all: ";
            if (flags & SubTargetOrdered) {
                if (target)
                    t << targets.at(target - 1)->target << "-qmake_all";
            } else {
                if (!subtarget->depends.isEmpty())
                    t << valGlue(subtarget->depends, QString(), "-qmake_all ", "-qmake_all");
            }
            t << " FORCE\n\t";
            if(!in_directory.isEmpty()) {
                t << mkdir_p_asstring(out_directory)
                  << out_directory_cdin;
            }
            t << "$(QMAKE) -o " << out << ' ' << in << buildArgs(false);
            if (!dont_recurse)
                writeSubMakeCall(t, out_directory_cdin, makefilein + " qmake_all");
            else
                t << Qt::endl;
        }

        { //actually compile
            t << subtarget->target << ":";
            auto extraDeps = extraSubTargetDependencies();
            if (!extraDeps.isEmpty())
                t << " " << valList(extraDeps);
            if(!subtarget->depends.isEmpty())
                t << " " << valList(subtarget->depends);
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein);
        }

        for(int suffix = 0; suffix < targetSuffixes.size(); ++suffix) {
            QString s = targetSuffixes.at(suffix);
            if(s == "install_subtargets")
                s = "install";
            else if(s == "uninstall_subtargets")
                s = "uninstall";
            else if(s == "make_first")
                s = QString();

            if (project->isActiveConfig("build_all") && s == "install") {
                if (!sequentialInstallData)
                    sequentialInstallData.reset(new SequentialInstallData);
                sequentialInstallData->targetPrefix += subtarget->target + '-';
                writeSubTargetCall(sequentialInstallData->commandsStream, in_directory, in,
                                   out_directory, out, out_directory_cdin,
                                   makefilein + " " + s);
                chopEndLines(&sequentialInstallData->commands);
            }

            if(flags & SubTargetOrdered) {
                t << subtarget->target << "-" << targetSuffixes.at(suffix) << "-ordered:";
                if(target)
                    t << " " << targets.at(target-1)->target << "-" << targetSuffixes.at(suffix) << "-ordered ";
                t << " FORCE";
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + s);
            }
            t << subtarget->target << "-" << targetSuffixes.at(suffix) << ":";
            if(!subtarget->depends.isEmpty())
                t << " " << valGlue(subtarget->depends, QString(), "-" + targetSuffixes.at(suffix) + " ",
                                    "-"+targetSuffixes.at(suffix));
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein + " " + s);
        }
    }
    t << Qt::endl;

    if (sequentialInstallData) {
        t << sequentialInstallData->targetPrefix << "install: FORCE"
          << sequentialInstallData->commands << Qt::endl << Qt::endl;
    }

    if (!(flags & SubTargetSkipDefaultTargets)) {
        writeMakeQmake(t, true);

        t << "qmake_all:";
        if(!targets.isEmpty()) {
            for(QList<SubTarget*>::Iterator it = targets.begin(); it != targets.end(); ++it) {
                if(!(*it)->profile.isEmpty())
                    t << " " << (*it)->target << "-qmake_all";
            }
        }
        t << " FORCE\n\n";
    }

    for(int s = 0; s < targetSuffixes.size(); ++s) {
        QString suffix = targetSuffixes.at(s);
        if(!(flags & SubTargetInstalls) && suffix.endsWith("install"))
            continue;

        t << suffix << ":";
        for(int target = 0; target < targets.size(); ++target) {
            SubTarget *subTarget = targets.at(target);
            const ProStringList &config = project->values(ProKey(subTarget->name + ".CONFIG"));
            if (suffix == "make_first"
                && config.indexOf("no_default_target") != -1) {
                continue;
            }
            if((suffix == "install_subtargets" || suffix == "uninstall_subtargets")
                && config.indexOf("no_default_install") != -1) {
                continue;
            }
            QString targetRule = subTarget->target + "-" + suffix;
            if(flags & SubTargetOrdered)
                targetRule += "-ordered";
            t << " " << targetRule;
        }
        if(suffix == "all" || suffix == "make_first")
            t << ' ' << depVar("ALL_DEPS");
        if(suffix == "clean")
            t << ' ' << depVar("CLEAN_DEPS");
        else if (suffix == "distclean")
            t << ' ' << depVar("DISTCLEAN_DEPS");
        t << " FORCE\n";
        if(suffix == "clean") {
            t << fixFileVarGlue("QMAKE_CLEAN", "\t-$(DEL_FILE) ", "\n\t-$(DEL_FILE) ", "\n");
        } else if(suffix == "distclean") {
            QString ofile = fileFixify(Option::output.fileName());
            if(!ofile.isEmpty())
                t << "\t-$(DEL_FILE) " << escapeFilePath(ofile) << Qt::endl;
            t << fixFileVarGlue("QMAKE_DISTCLEAN", "\t-$(DEL_FILE) ", " ", "\n");
        }
    }

    // user defined targets
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator qut_it = qut.begin(); qut_it != qut.end(); ++qut_it) {
        const ProStringList &config = project->values(ProKey(*qut_it + ".CONFIG"));
        QString targ = var(ProKey(*qut_it + ".target")),
                 cmd = var(ProKey(*qut_it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*qut_it).toQString();
        t << Qt::endl;

        const ProStringList &deplist = project->values(ProKey(*qut_it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += ' ' + escapeDependencyPath(Option::fixPathToTargetOS(dep, false));
        }
        if (config.indexOf("recursive") != -1) {
            QSet<QString> recurse;
            const ProKey rkey(*qut_it + ".recurse");
            if (project->isSet(rkey)) {
                const QStringList values = project->values(rkey).toQStringList();
                recurse = QSet<QString>(values.begin(), values.end());
            } else {
                for(int target = 0; target < targets.size(); ++target)
                    recurse.insert(targets.at(target)->name);
            }
            for(int target = 0; target < targets.size(); ++target) {
                SubTarget *subtarget = targets.at(target);
                QString in_directory = subtarget->in_directory;
                if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
                    in_directory += Option::dir_sep;
                QString out_directory = subtarget->out_directory;
                if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
                    out_directory += Option::dir_sep;
                if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
                    out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

                if(!recurse.contains(subtarget->name))
                    continue;

                QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                                     : "\n\tcd " + escapeFilePath(out_directory) + " && ";
                QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

                QString out;
                QString in;
                if (!subtarget->profile.isEmpty()) {
                    out = subtarget->makefile;
                    in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
                    if (out.startsWith(in_directory))
                        out = out.mid(in_directory.size());
                    out = escapeFilePath(out);
                }

                //write the rule/depends
                if(flags & SubTargetOrdered) {
                    const QString dep = subtarget->target + "-" + (*qut_it) + "_ordered";
                    t << dep << ":";
                    if(target)
                        t << " " << targets.at(target-1)->target << "-" << (*qut_it) << "_ordered ";
                    deps += " " + dep;
                } else {
                    const QString dep = subtarget->target + "-" + (*qut_it);
                    t << dep << ":";
                    if(!subtarget->depends.isEmpty())
                        t << " " << valGlue(subtarget->depends, QString(), "-" + (*qut_it) + " ", "-" + (*qut_it));
                    deps += " " + dep;
                }

                QString sub_targ = targ;
                const ProKey rtkey(*qut_it + ".recurse_target");
                if (project->isSet(rtkey))
                    sub_targ = project->first(rtkey).toQString();

                //write the commands
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + sub_targ);
            }
        }
        if (config.indexOf("phony") != -1)
            deps += " FORCE";
        t << escapeDependencyPath(Option::fixPathToTargetOS(targ, false)) << ":" << deps << "\n";
        if(!cmd.isEmpty())
            t << "\t" << cmd << Qt::endl;
    }

    if(flags & SubTargetInstalls) {
        project->values("INSTALLDEPS")   += "install_subtargets";
        project->values("UNINSTALLDEPS") += "uninstall_subtargets";
        writeInstalls(t, true);
    }
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
}